

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authprogs_test_driver.c
# Opt level: O2

int main(int ac,char **av)

{
  char **argv;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  clock_t cVar5;
  clock_t cVar6;
  functionMapEntry *pfVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  int testNum;
  char **local_40;
  char **local_38;
  
  testNum = 0;
  if (ac < 2) {
    puts("Available tests:");
    pfVar7 = cmakeGeneratedFunctionMapEntries;
    for (uVar11 = 0; uVar11 != 3; uVar11 = uVar11 + 1) {
      printf("%3d. %s\n",uVar11 & 0xffffffff,pfVar7->name);
      pfVar7 = pfVar7 + 1;
    }
    printf("To run a test, enter the test number: ");
    fflush(_stdout);
    iVar1 = __isoc99_scanf("%d",&testNum);
    if (iVar1 != 1) {
      pcVar10 = "Couldn\'t parse that input as a number";
      goto LAB_0010241b;
    }
    uVar11 = (ulong)(uint)testNum;
    if (2 < testNum) {
      pcVar10 = "%3d is an invalid test number.\n";
      goto LAB_00102521;
    }
    ac = ac - 1;
    av = av + 1;
  }
  else {
    uVar11 = 0xffffffffffffffff;
  }
  local_40 = av;
  if (ac < 2 || (int)uVar11 != -1) {
    bVar12 = false;
    if ((int)uVar11 == -1) {
      uVar8 = 0;
      bVar12 = false;
      goto LAB_0010244c;
    }
    bVar13 = true;
    pcVar10 = (char *)0x0;
  }
  else {
    pcVar10 = av[1];
    uVar8 = 0;
    bVar12 = false;
    if (*pcVar10 == '-') {
      uVar8 = 0;
      bVar12 = false;
      if (pcVar10[1] == 'R') {
        bVar12 = pcVar10[2] == '\0';
        if (bVar12 && (uint)ac < 3) {
          pcVar10 = "-R needs an additional parameter.";
LAB_0010241b:
          puts(pcVar10);
          return -1;
        }
        uVar8 = (ulong)(pcVar10[2] == '\0');
      }
      if ((pcVar10[1] == 'A') && (pcVar10[2] == '\0')) {
        puts("TAP version 13");
        printf("1..%d\n",3);
        local_38 = av + 2;
        uVar11 = 0;
        while (uVar11 != 3) {
          pcVar10 = cmakeGeneratedFunctionMapEntries[uVar11].name;
          if (((uint)ac < 3) || (iVar1 = isTestSkipped(pcVar10,ac - 2,local_38), iVar1 == 0)) {
            cVar5 = clock();
            iVar1 = (*cmakeGeneratedFunctionMapEntries[uVar11].func)(ac,local_40);
            cVar6 = clock();
            pcVar3 = "ok";
            if (iVar1 == -1) {
              pcVar3 = "not ok";
            }
            uVar11 = uVar11 + 1;
            printf("%s %d %s # %f\n",(double)(cVar6 - cVar5) / 1000000.0,pcVar3,uVar11 & 0xffffffff,
                   pcVar10);
          }
          else {
            uVar11 = uVar11 + 1;
            printf("ok %d %s # SKIP\n",uVar11 & 0xffffffff,pcVar10);
          }
        }
        puts("All tests finished.");
        return 0;
      }
    }
LAB_0010244c:
    pcVar10 = lowercase(av[uVar8 + 1]);
    bVar13 = (int)uVar8 == 0;
  }
  pfVar7 = cmakeGeneratedFunctionMapEntries;
  for (uVar8 = 0; (uVar9 = (uint)uVar11, uVar9 == 0xffffffff && (uVar8 < 3)); uVar8 = uVar8 + 1) {
    pcVar3 = lowercase(pfVar7->name);
    if ((bVar12) && (pcVar4 = strstr(pcVar3,pcVar10), pcVar4 != (char *)0x0)) {
      ac = ac - 2;
      local_40 = local_40 + 2;
LAB_001024d8:
      uVar11 = uVar8 & 0xffffffff;
    }
    else {
      if ((bVar13) && (iVar1 = strcmp(pcVar3,pcVar10), iVar1 == 0)) {
        ac = ac - 1;
        local_40 = local_40 + 1;
        goto LAB_001024d8;
      }
      uVar11 = 0xffffffffffffffff;
    }
    free(pcVar3);
    pfVar7 = pfVar7 + 1;
  }
  free(pcVar10);
  argv = local_40;
  if (uVar9 == 0xffffffff) {
    puts("Available tests:");
    pfVar7 = cmakeGeneratedFunctionMapEntries;
    for (uVar11 = 0; uVar11 != 3; uVar11 = uVar11 + 1) {
      printf("%3d. %s\n",uVar11 & 0xffffffff,pfVar7->name);
      pfVar7 = pfVar7 + 1;
    }
    printf("Failed: %s is an invalid test name.\n",local_40[1]);
    return -1;
  }
  iVar1 = test_framework_init(ac,local_40);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (uVar9 < 3) {
    iVar1 = (*cmakeGeneratedFunctionMapEntries[uVar11 & 0xffffffff].func)(ac,argv);
    iVar2 = test_framework_uninit(ac,argv,iVar1);
    if (iVar2 == 0) {
      return iVar1;
    }
    return iVar2;
  }
  pcVar10 = "testToRun was modified by TestDriver code to an invalid value: %3d.\n";
LAB_00102521:
  printf(pcVar10,(ulong)(uint)testNum);
  return -1;
}

Assistant:

int main(int ac, char* av[])
{
  int i;
  int testNum = 0;
  int partial_match;
  int run_all;
  char *arg;
  int testToRun = -1;

  

  /* If no test name was given */
  /* process command line with user function.  */
  if (ac < 2) {
    /* Ask for a test.  */
    printf("Available tests:\n");
    for (i = 0; i < NumTests; ++i) {
      printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(stdout);
    if (scanf("%d", &testNum) != 1) {
      printf("Couldn't parse that input as a number\n");
      return -1;
    }
    if (testNum >= NumTests) {
      printf("%3d is an invalid test number.\n", testNum);
      return -1;
    }
    testToRun = testNum;
    ac--;
    av++;
  }
  partial_match = 0;
  run_all = 0;
  arg = CM_NULL; /* NOLINT */
  /* If partial match or running all tests are requested.  */
  if (testToRun == -1 && ac > 1) {
    partial_match = (strcmp(av[1], "-R") == 0) ? 1 : 0;
    run_all = (strcmp(av[1], "-A") == 0) ? 1 : 0;
  }
  if (partial_match != 0 && ac < 3) {
    printf("-R needs an additional parameter.\n");
    return -1;
  }
  if (run_all == 1) {
    clock_t t;
    int status = 0;
    const char* status_message = CM_NULL;
    printf("TAP version 13\n");
    printf("1..%d\n", NumTests);
    for (i = 0; i < NumTests; ++i) {
      const char *name = cmakeGeneratedFunctionMapEntries[i].name;
      if (ac > 2) {
        if (isTestSkipped(name, ac - 2, av + 2) == 1) {
          printf("ok %d %s # SKIP\n", i + 1, name);
          continue;
        }
      }
      t = clock();
      status = (*cmakeGeneratedFunctionMapEntries[i].func)(ac, av);
      t = clock() - t;
      status_message = (status == -1) ? "not ok" : "ok";
      {
        double time_taken = CM_CAST(double, t) / CLOCKS_PER_SEC;
        printf("%s %d %s # %f\n", status_message, i + 1, name, time_taken);
      }
    }
    printf("All tests finished.\n");

    return 0;
  }

  if (testToRun == -1) {
    arg = lowercase(av[1 + partial_match]);
  }
  for (i = 0; i < NumTests && testToRun == -1; ++i) {
    char *test_name = lowercase(cmakeGeneratedFunctionMapEntries[i].name);
    if (partial_match != 0 && strstr(test_name, arg) != CM_NULL) { /* NOLINT */
      testToRun = i;
      ac -= 2;
      av += 2;
    } else if (partial_match == 0 && strcmp(test_name, arg) == 0) {
      testToRun = i;
      ac--;
      av++;
    }
    free(test_name);
  }
  free(arg);
  if (testToRun != -1) {
    int result;
int rc = test_framework_init(ac, av); if (rc != TEST_NO_ERROR) return rc;
    if (testToRun < 0 || testToRun >= NumTests) {
      printf("testToRun was modified by TestDriver code to an invalid value: "
             "%3d.\n",
             testNum);
      return -1;
    }
    result = (*cmakeGeneratedFunctionMapEntries[testToRun].func)(ac, av);
rc = test_framework_uninit(ac, av, result); if (rc != TEST_NO_ERROR) return rc;
    return result;
  }

  /* Nothing was run, display the test names.  */
  printf("Available tests:\n");
  for (i = 0; i < NumTests; ++i) {
    printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
  }
  printf("Failed: %s is an invalid test name.\n", av[1]);

  return -1;
}